

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppc.c
# Opt level: O1

int main(void)

{
  int iVar1;
  x86_reg xVar2;
  cs_detail *pcVar3;
  size_t count;
  cs_err cVar4;
  uint uVar5;
  size_t len;
  size_t len_00;
  x86_avx_rm *pxVar6;
  char *pcVar7;
  char *__format;
  size_t sVar8;
  ulong uVar9;
  cs_insn *insn;
  cs_insn *local_40;
  size_t local_38;
  
  cVar4 = cs_open(CS_ARCH_PPC,CS_MODE_BIG_ENDIAN,&handle);
  if (cVar4 == CS_ERR_OK) {
    cs_option(handle,CS_OPT_DETAIL,3);
    local_38 = cs_disasm(handle,(uint8_t *)anon_var_dwarf_27,0x34,0x1000,0,&local_40);
    if (local_38 == 0) {
      puts("****************");
      printf("Platform: %s\n","PPC-64");
      print_string_hex(anon_var_dwarf_27,(uchar *)0x34,len_00);
      puts("ERROR: Failed to disasm given code!");
    }
    else {
      puts("****************");
      printf("Platform: %s\n","PPC-64");
      print_string_hex(anon_var_dwarf_27,(uchar *)0x34,len);
      puts("Disasm:");
      sVar8 = 0;
      do {
        printf("0x%lx:\t%s\t%s\n",local_40[sVar8].address,local_40[sVar8].mnemonic,
               local_40[sVar8].op_str);
        pcVar3 = local_40[sVar8].detail;
        if (pcVar3 != (cs_detail *)0x0) {
          if ((pcVar3->field_6).x86.addr_size != '\0') {
            printf("\top_count: %u\n");
          }
          if ((pcVar3->field_6).x86.addr_size != '\0') {
            pxVar6 = &(pcVar3->field_6).x86.sib_base;
            uVar9 = 0;
            do {
              iVar1 = pxVar6[-3];
              if (iVar1 < 3) {
                if (iVar1 == 1) {
                  pcVar7 = cs_reg_name(handle,pxVar6[-2]);
                  __format = "\t\toperands[%u].type: REG = %s\n";
LAB_00143435:
                  printf(__format,uVar9 & 0xffffffff,pcVar7);
                }
                else if (iVar1 == 2) {
                  xVar2 = pxVar6[-2];
                  pcVar7 = "\t\toperands[%u].type: IMM = 0x%x\n";
LAB_00143484:
                  printf(pcVar7,uVar9 & 0xffffffff,(ulong)xVar2);
                }
              }
              else if (iVar1 == 3) {
                printf("\t\toperands[%u].type: MEM\n",uVar9 & 0xffffffff);
                if (pxVar6[-2] != X86_REG_INVALID) {
                  pcVar7 = cs_reg_name(handle,pxVar6[-2]);
                  printf("\t\t\toperands[%u].mem.base: REG = %s\n",uVar9 & 0xffffffff,pcVar7);
                }
                xVar2 = pxVar6[-1];
                if (xVar2 != X86_REG_INVALID) {
                  pcVar7 = "\t\t\toperands[%u].mem.disp: 0x%x\n";
                  goto LAB_00143484;
                }
              }
              else if (iVar1 == 0x40) {
                printf("\t\toperands[%u].type: CRX\n",uVar9 & 0xffffffff);
                printf("\t\t\toperands[%u].crx.scale: %d\n",uVar9 & 0xffffffff,(ulong)pxVar6[-2]);
                pcVar7 = cs_reg_name(handle,pxVar6[-1]);
                printf("\t\t\toperands[%u].crx.reg: %s\n",uVar9 & 0xffffffff,pcVar7);
                uVar5 = (*pxVar6 - X86_REG_BH) * 0x20000000 | *pxVar6 - X86_REG_BH >> 3;
                pcVar7 = "invalid";
                if (uVar5 < 0x12) {
                  pcVar7 = &DAT_001c903c + *(int *)(&DAT_001c903c + (ulong)uVar5 * 4);
                }
                __format = "\t\t\toperands[%u].crx.cond: %s\n";
                goto LAB_00143435;
              }
              uVar9 = uVar9 + 1;
              pxVar6 = pxVar6 + 4;
            } while (uVar9 < (pcVar3->field_6).x86.addr_size);
          }
          if ((pcVar3->field_6).arm64.cc != ARM64_CC_INVALID) {
            printf("\tBranch code: %u\n");
          }
          if ((pcVar3->field_6).arm.vector_size != 0) {
            printf("\tBranch hint: %u\n");
          }
          if ((pcVar3->field_6).x86.rex == '\x01') {
            puts("\tUpdate-CR0: True");
          }
          putchar(10);
        }
        count = local_38;
        sVar8 = sVar8 + 1;
      } while (sVar8 != local_38);
      printf("0x%lx:\n",(ulong)local_40[local_38 - 1].size + local_40[local_38 - 1].address);
      cs_free(local_40,count);
    }
    putchar(10);
    cs_close(&handle);
  }
  else {
    printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar4);
  }
  return 0;
}

Assistant:

static void test()
{
#define PPC_CODE "\x43\x20\x0c\x07\x41\x56\xff\x17\x80\x20\x00\x00\x80\x3f\x00\x00\x10\x43\x23\x0e\xd0\x44\x00\x80\x4c\x43\x22\x02\x2d\x03\x00\x80\x7c\x43\x20\x14\x7c\x43\x20\x93\x4f\x20\x00\x21\x4c\xc8\x00\x21\x40\x82\x00\x14"

	struct platform platforms[] = {
		{
			CS_ARCH_PPC,
			CS_MODE_BIG_ENDIAN,
			(unsigned char*)PPC_CODE,
			sizeof(PPC_CODE) - 1,
			"PPC-64",
		}
	};

	uint64_t address = 0x1000;
	cs_insn *insn;
	int i;
	size_t count;

	for (i = 0; i < sizeof(platforms)/sizeof(platforms[0]); i++) {
		cs_err err = cs_open(platforms[i].arch, platforms[i].mode, &handle);
		if (err) {
			printf("Failed on cs_open() with error returned: %u\n", err);
			continue;
		}

		cs_option(handle, CS_OPT_DETAIL, CS_OPT_ON);

		count = cs_disasm(handle, platforms[i].code, platforms[i].size, address, 0, &insn);
		if (count) {
			size_t j;

			printf("****************\n");
			printf("Platform: %s\n", platforms[i].comment);
			print_string_hex("Code:", platforms[i].code, platforms[i].size);
			printf("Disasm:\n");

			for (j = 0; j < count; j++) {
				printf("0x%" PRIx64 ":\t%s\t%s\n", insn[j].address, insn[j].mnemonic, insn[j].op_str);
				print_insn_detail(&insn[j]);
			}
			printf("0x%" PRIx64 ":\n", insn[j-1].address + insn[j-1].size);

			// free memory allocated by cs_disasm()
			cs_free(insn, count);
		} else {
			printf("****************\n");
			printf("Platform: %s\n", platforms[i].comment);
			print_string_hex("Code:", platforms[i].code, platforms[i].size);
			printf("ERROR: Failed to disasm given code!\n");
		}

		printf("\n");

		cs_close(&handle);
	}
}